

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintThreeBBShaft.cpp
# Opt level: O2

void __thiscall
chrono::ChConstraintThreeBBShaft::SetVariables
          (ChConstraintThreeBBShaft *this,ChVariables *mvariables_a,ChVariables *mvariables_b,
          ChVariables *mvariables_c)

{
  uint __line;
  long lVar1;
  char *__assertion;
  
  if (mvariables_a != (ChVariables *)0x0) {
    lVar1 = __dynamic_cast(mvariables_a,&ChVariables::typeinfo,&ChVariablesBody::typeinfo,0);
    if (lVar1 != 0) {
      if (mvariables_b != (ChVariables *)0x0) {
        lVar1 = __dynamic_cast(mvariables_b,&ChVariables::typeinfo,&ChVariablesBody::typeinfo,0);
        if (lVar1 != 0) {
          if (mvariables_c != (ChVariables *)0x0) {
            lVar1 = __dynamic_cast(mvariables_c,&ChVariables::typeinfo,&ChVariablesBody::typeinfo,0)
            ;
            if (lVar1 != 0) {
              (this->super_ChConstraintThree).super_ChConstraint.valid = true;
              ChConstraint::UpdateActiveFlag((ChConstraint *)this);
              (this->super_ChConstraintThree).variables_a = mvariables_a;
              (this->super_ChConstraintThree).variables_b = mvariables_b;
              (this->super_ChConstraintThree).variables_c = mvariables_c;
              Eigen::DenseBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>::setZero
                        ((DenseBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_> *)&this->Cq_a);
              Eigen::DenseBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>::setZero
                        ((DenseBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_> *)&this->Cq_b);
              Eigen::DenseBase<Eigen::Matrix<double,_1,_1,_1,_1,_1>_>::setZero
                        ((DenseBase<Eigen::Matrix<double,_1,_1,_1,_1,_1>_> *)&this->Cq_c);
              return;
            }
          }
          __assertion = "dynamic_cast<ChVariablesBody*>(mvariables_c)";
          __line = 0x40;
          goto LAB_00d2f760;
        }
      }
      __assertion = "dynamic_cast<ChVariablesBody*>(mvariables_b)";
      __line = 0x3f;
      goto LAB_00d2f760;
    }
  }
  __assertion = "dynamic_cast<ChVariablesBody*>(mvariables_a)";
  __line = 0x3e;
LAB_00d2f760:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChConstraintThreeBBShaft.cpp"
                ,__line,
                "virtual void chrono::ChConstraintThreeBBShaft::SetVariables(ChVariables *, ChVariables *, ChVariables *)"
               );
}

Assistant:

void ChConstraintThreeBBShaft::SetVariables(ChVariables* mvariables_a,
                                            ChVariables* mvariables_b,
                                            ChVariables* mvariables_c) {
    assert(dynamic_cast<ChVariablesBody*>(mvariables_a));
    assert(dynamic_cast<ChVariablesBody*>(mvariables_b));
    assert(dynamic_cast<ChVariablesBody*>(mvariables_c));

    if (!mvariables_a || !mvariables_b || !mvariables_c) {
        SetValid(false);
        return;
    }

    SetValid(true);
    variables_a = mvariables_a;
    variables_b = mvariables_b;
    variables_c = mvariables_c;
    Cq_a.setZero();
    Cq_b.setZero();
    Cq_c.setZero();
}